

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckLineLength.cxx
# Opt level: O0

bool __thiscall
kws::Parser::CheckLineLength(Parser *this,unsigned_long max,bool checkHeader,bool doErrorCheck)

{
  undefined1 auVar1 [16];
  byte bVar2;
  _Ios_Openmode _Var3;
  ulong uVar4;
  ostream *poVar5;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  char localval [21];
  size_t length_1;
  Error error;
  long line_length;
  long line_count;
  long line_end;
  long line_start;
  size_t inStrSize;
  char *inch;
  size_t cc;
  size_t endHeader;
  ifstream file;
  size_t fileSize;
  bool hasError;
  char *val;
  size_t length;
  value_type_conflict *in_stack_fffffffffffffc98;
  char *pcVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffca0;
  value_type *in_stack_fffffffffffffca8;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffffcb0;
  char local_308 [32];
  undefined8 local_2e8;
  long local_2e0;
  long local_2d8;
  undefined8 local_2d0;
  string local_2c8 [32];
  long local_2a8;
  undefined8 local_2a0;
  long local_298;
  value_type *local_290;
  undefined1 *local_288;
  value_type *local_280;
  char *local_278;
  value_type *local_270;
  value_type *local_268;
  undefined1 local_260 [2] [16];
  char local_240 [520];
  value_type *local_38;
  byte local_29;
  char *local_28;
  undefined8 local_20;
  byte local_12;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  *(undefined1 *)(in_RDI + 0x30) = 1;
  local_20 = 0xff;
  local_10 = in_RSI;
  local_28 = (char *)operator_new__(0xff);
  snprintf(local_28,0xff,"Line Length = %ld max chars",local_10);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x58),local_28);
  if (local_28 != (char *)0x0) {
    operator_delete__(local_28);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x19d554);
  local_29 = 0;
  local_38 = (value_type *)0x0;
  if ((local_11 & 1) == 0) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::ifstream::ifstream(local_240);
      _Var3 = std::__cxx11::string::c_str();
      std::operator|(_S_bin,_S_in);
      std::ifstream::open(local_240,_Var3);
      bVar2 = std::ifstream::is_open();
      if ((bVar2 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"CheckLineLength() - Cannot open file: ");
        poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0x5a8));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::istream::seekg((long)local_240,_S_beg);
        local_260[0] = std::istream::tellg();
        in_stack_fffffffffffffcb0 = local_260[0]._8_8_;
        in_stack_fffffffffffffca8 =
             (value_type *)std::fpos::operator_cast_to_long((fpos *)local_260);
        local_38 = in_stack_fffffffffffffca8;
        std::ifstream::close();
      }
      std::ifstream::~ifstream(local_240);
    }
    else {
      local_268 = (value_type *)std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c58);
      auVar1._8_8_ = local_260[0]._8_8_;
      auVar1._0_8_ = local_260[0]._0_8_;
      if (local_268 != (value_type *)0xffffffffffffffff) {
        local_38 = local_268;
        local_260[0] = auVar1;
      }
    }
  }
  local_278 = (char *)std::__cxx11::string::c_str();
  local_280 = (value_type *)std::__cxx11::string::size();
  local_288 = (undefined1 *)0x0;
  local_290 = (value_type *)0x0;
  local_298 = 1;
  local_2a0 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  for (local_270 = (value_type *)0x0; local_270 < local_280;
      local_270 = (value_type *)((long)&local_270->line + 1)) {
    if (*local_278 == '\n') {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcb0,
                 &in_stack_fffffffffffffca8->line);
      local_290 = local_270;
      local_2a8 = (long)local_270 + (-1 - (long)local_288);
      if ((((local_12 & 1) != 0) && (local_10 < local_2a8)) && (local_38 < local_270)) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x19d87d);
        local_2e0 = local_298;
        local_2d8 = local_298;
        local_2d0 = 0;
        std::__cxx11::string::operator=(local_2c8,"Line length exceed ");
        local_2e8 = 0x15;
        pcVar6 = local_308;
        snprintf(pcVar6,0x15,"%ld",local_2a8);
        std::__cxx11::string::operator+=(local_2c8,pcVar6);
        std::__cxx11::string::operator+=(local_2c8," (max=");
        pcVar6 = local_308;
        snprintf(pcVar6,0x15,"%ld",local_10);
        std::__cxx11::string::operator+=(local_2c8,pcVar6);
        std::__cxx11::string::operator+=(local_2c8,")");
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        local_29 = 1;
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x19d990);
      }
      local_288 = (undefined1 *)((long)&local_270->line + 1);
      local_298 = local_298 + 1;
    }
    local_278 = local_278 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcb0,
             &in_stack_fffffffffffffca8->line);
  return (bool)((local_29 ^ 0xff) & 1);
}

Assistant:

bool Parser::CheckLineLength(unsigned long max,bool checkHeader, bool doErrorCheck)
{
  m_TestsDone[LINE_LENGTH] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Line Length = %ld max chars",max);
  m_TestsDescription[LINE_LENGTH] = val;
  delete [] val;

  m_Positions.clear();
  bool hasError = false;

  size_t fileSize = 0;

  // If we do not want to check the header
  if(!checkHeader)
    {
    if (!m_HeaderFilename.empty()) {
      std::ifstream file;
      file.open(m_HeaderFilename.c_str(), std::ios::binary | std::ios::in);
      if(!file.is_open())
        {
        std::cout << "CheckLineLength() - Cannot open file: "
                  << m_HeaderFilename << std::endl;
        }
      else
        {
        file.seekg(0,std::ios::end);
        fileSize = file.tellg();
        file.close();
        }
    } else {
      // we look at the first '*/' in the file which indicated the end of the current header
      // This assume that there is an header at some point
      size_t endHeader = m_Buffer.find("*/",0);
      if(endHeader != std::string::npos)
        {
        fileSize = endHeader;
        }
    }
    }

  size_t cc;
  const char* inch = m_Buffer.c_str();
  size_t inStrSize = m_Buffer.size();
  long int line_start = 0;
  long int line_end = 0;
  long int line_count = 1;
  m_Positions.push_back(0);
  for ( cc = 0; cc < inStrSize; ++ cc )
    {
    if ( *inch == '\n' )
      {
      m_Positions.push_back(cc);
      line_end = static_cast<long int>(cc);
      long int line_length = line_end - line_start-1;
      if(doErrorCheck && (line_length > (long int)max && cc>fileSize))
        {
        Error error;
        error.line = line_count;
        error.line2 = error.line;
        error.number = LINE_LENGTH;
        error.description = "Line length exceed ";
        constexpr size_t length = 21;
        char localval[length];
        snprintf(localval,length,"%ld",line_length);
        error.description += localval;
        error.description += " (max=";
        snprintf(localval,length,"%ld",max);
        error.description += localval;
        error.description += ")";
        m_ErrorList.push_back(error);
        hasError = true;
        }
      line_start = static_cast<long int>(cc) + 1;
      line_count ++;
      }
    inch ++;
    }
  m_Positions.push_back(cc);

  return !hasError;
}